

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glloader.c
# Opt level: O0

ktx_error_code_e
compressedTexImage1DCallback
          (int miplevel,int face,int width,int height,int depth,ktx_uint64_t faceLodSize,
          void *pixels,void *userdata)

{
  GLenum GVar1;
  GLsizei in_EDX;
  int in_ESI;
  GLint in_EDI;
  ulong in_R9;
  void *in_stack_00000008;
  ktx_cbdata *cbData;
  ktx_error_code_e local_4;
  
  if (in_R9 < 0x100000000) {
    if (gl.glCompressedTexImage1D == (PFNGLCOMPRESSEDTEXIMAGE1DPROC)0x0) {
      __assert_fail("gl.glCompressedTexImage1D != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/glloader.c"
                    ,0x1ec,
                    "ktx_error_code_e compressedTexImage1DCallback(int, int, int, int, int, ktx_uint64_t, void *, void *)"
                   );
    }
    (*gl.glCompressedTexImage1D)
              (cbData->glTarget + in_ESI,in_EDI,cbData->glInternalformat,in_EDX,0,(GLsizei)in_R9,
               in_stack_00000008);
    GVar1 = (*gl.glGetError)();
    cbData->glError = GVar1;
    if (GVar1 == 0) {
      local_4 = KTX_SUCCESS;
    }
    else {
      local_4 = KTX_GL_ERROR;
    }
  }
  else {
    local_4 = KTX_INVALID_OPERATION;
  }
  return local_4;
}

Assistant:

KTX_error_code
compressedTexImage1DCallback(int miplevel, int face,
                             int width, int height,
                             int depth,
                             ktx_uint64_t faceLodSize,
                             void* pixels, void* userdata)
{
    ktx_cbdata* cbData = (ktx_cbdata*)userdata;
    UNUSED(depth);
    UNUSED(height);

    if (faceLodSize > UINT32_MAX)
        return KTX_INVALID_OPERATION; // Too big for OpenGL {,ES}.

    assert(gl.glCompressedTexImage1D != NULL);
    gl.glCompressedTexImage1D(cbData->glTarget + face, miplevel,
                             cbData->glInternalformat, width, 0,
                             (ktx_uint32_t)faceLodSize, pixels);

    if ((cbData->glError = glGetError()) == GL_NO_ERROR) {
        return KTX_SUCCESS;
    } else {
        return KTX_GL_ERROR;
    }
}